

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2019::DataTransform<unsigned_short,_double>::Run
          (DataTransform<unsigned_short,_double> *this,istream *input_stream)

{
  double dVar1;
  NumericType NVar2;
  WarningType WVar3;
  uint uVar4;
  ulong uVar5;
  ostream *poVar6;
  size_t *__idx;
  int iVar7;
  bool bVar8;
  ushort in_FPUControlWord;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  double dVar9;
  unsigned_short input_data;
  ushort local_28c;
  allocator local_289;
  uint local_288;
  int local_284;
  string *local_280;
  double local_278;
  double local_270;
  double local_268;
  undefined8 uStack_260;
  string local_250;
  string word;
  char buffer [128];
  
  local_280 = &this->print_format_;
  iVar7 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      std::operator>>(input_stream,(string *)&word);
      bVar8 = word._M_string_length == 0;
      if (!bVar8) {
        std::__cxx11::stold((longdouble *)&word,(string *)0x0,__idx);
        local_28c = in_FPUControlWord | 0xc00;
        local_284 = (int)ROUND(in_ST0);
        input_data = (unsigned_short)local_284;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      std::__cxx11::string::~string((string *)&word);
      if (!bVar8) goto LAB_001253dd;
      if (bVar8) {
        if (!bVar8) {
          return false;
        }
        goto LAB_00125616;
      }
    }
    else {
      bVar8 = sptk::ReadStream<unsigned_short>(&input_data,input_stream);
      if (!bVar8) {
LAB_00125616:
        if (this->is_ascii_output_ != true) {
          return true;
        }
        if (iVar7 % this->num_column_ != 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          return true;
        }
        return true;
      }
LAB_001253dd:
      uVar5 = (ulong)input_data;
      dVar9 = this->minimum_value_;
      dVar1 = this->maximum_value_;
      uVar4 = (uint)input_data;
      if (dVar1 <= dVar9) {
LAB_00125560:
        dVar9 = (double)uVar4;
        in_ST7 = in_ST6;
        if (this->rounding_ == true) {
          if (uVar5 == 0) {
            dVar9 = dVar9 + -0.5;
          }
          else {
            dVar9 = dVar9 + 0.5;
          }
        }
      }
      else {
        NVar2 = this->input_numeric_type_;
        if (NVar2 == kFloatingPoint) {
          in_ST6 = in_ST5;
          local_288 = uVar4;
          local_270 = dVar9;
          if (((double)uVar4 < dVar9) || (dVar9 = dVar1, local_278 = dVar1, dVar1 < (double)uVar4))
          goto LAB_001254e5;
          goto LAB_00125560;
        }
        if (NVar2 == kUnsignedInteger) {
          if (((ulong)((long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f | (long)dVar9) <=
               uVar5) &&
             (dVar9 = dVar1,
             uVar5 <= (ulong)((long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f |
                             (long)dVar1))) goto LAB_00125560;
        }
        else if ((NVar2 != kSignedInteger) ||
                (((long)dVar9 <= (long)uVar5 && (dVar9 = dVar1, (long)uVar5 <= (long)dVar1))))
        goto LAB_00125560;
LAB_001254e5:
        in_ST7 = in_ST6;
        if (this->warning_type_ != kIgnore) {
          uStack_260 = 0;
          local_268 = dVar9;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&word);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)&word,iVar7);
          std::operator<<(poVar6,"th data is over the range of output type");
          std::__cxx11::string::string((string *)&local_250,"x2x",&local_289);
          sptk::PrintErrorMessage(&local_250,(ostringstream *)&word);
          std::__cxx11::string::~string((string *)&local_250);
          WVar3 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&word);
          dVar9 = local_268;
          if (WVar3 == kExit) {
            return false;
          }
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar8 = sptk::SnPrintf<double>(dVar9,local_280,0x80,buffer);
        if (!bVar8) {
          return false;
        }
        std::operator<<((ostream *)&std::cout,buffer);
        if ((iVar7 + 1) % this->num_column_ == 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
        else {
          std::operator<<((ostream *)&std::cout,"\t");
        }
      }
      else {
        bVar8 = sptk::WriteStream<double>(dVar9,(ostream *)&std::cout);
        if (!bVar8) {
          return false;
        }
      }
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }